

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O0

err_t BufWrite(bufstream *p,uint8_t *Data,size_t Size,size_t *Written)

{
  ulong local_40;
  size_t Left;
  size_t Pos;
  err_t Err;
  size_t *Written_local;
  size_t Size_local;
  uint8_t *Data_local;
  bufstream *p_local;
  
  Pos = 0;
  Left = 0;
  Err = (err_t)Written;
  Written_local = (size_t *)Size;
  Size_local = (size_t)Data;
  Data_local = (uint8_t *)p;
  while( true ) {
    local_40 = (long)Written_local - Left;
    if ((local_40 == 0) ||
       ((0xfff < *(ulong *)(Data_local + 0x138) &&
        (Pos = BufFlush((bufstream *)Data_local), Pos != 0)))) goto LAB_0014d0ab;
    if ((*(long *)(Data_local + 0x138) == 0) && (0x1000 < local_40)) break;
    if (0x1000U - *(long *)(Data_local + 0x138) < local_40) {
      local_40 = 0x1000 - *(long *)(Data_local + 0x138);
    }
    memcpy(Data_local + *(long *)(Data_local + 0x138) + 0x140,(void *)(Size_local + Left),local_40);
    Left = local_40 + Left;
    *(ulong *)(Data_local + 0x138) = local_40 + *(long *)(Data_local + 0x138);
  }
  if (*(long *)(Data_local + 0x120) == 0) {
    __assert_fail("(const void*)(p->Stream)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                  ,0x6a,"err_t BufWrite(bufstream *, const uint8_t *, size_t, size_t *)");
  }
  Pos = (**(code **)(*(long *)(*(long *)(Data_local + 0x120) + 8) + 0x70))
                  (*(undefined8 *)(Data_local + 0x120),Size_local + Left,local_40,&local_40);
  Left = local_40 + Left;
LAB_0014d0ab:
  if (Err != 0) {
    *(size_t *)Err = Left;
  }
  return Pos;
}

Assistant:

static err_t BufWrite(bufstream* p,const uint8_t* Data,size_t Size,size_t* Written)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->WritePos >= BUFSTREAM_SIZE && (Err = BufFlush(p)) != ERR_NONE)
            break;

        if (!p->WritePos && Left > BUFSTREAM_SIZE)
        {
            Err = Stream_Write(p->Stream,Data+Pos,Left,&Left);
            Pos += Left;
            break;
        }

        if (Left > BUFSTREAM_SIZE - p->WritePos)
            Left = BUFSTREAM_SIZE - p->WritePos;

        memcpy(p->Buffer+p->WritePos,Data+Pos,Left);
        Pos += Left;
        p->WritePos += Left;
    }

    if (Written)
        *Written = Pos;
    return Err;
}